

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

int ply_read_word(p_ply ply)

{
  int iVar1;
  p_ply ptVar2;
  size_t sVar3;
  p_ply in_RDI;
  size_t t;
  
  while (ptVar2 = (p_ply)strspn(in_RDI->buffer + in_RDI->buffer_first," \n\r\t"),
        (p_ply)(in_RDI->buffer_last - in_RDI->buffer_first) <= ptVar2) {
    iVar1 = BREFILL(ptVar2);
    if (iVar1 == 0) {
      ply_ferror(in_RDI,"Unexpected end of file");
      return 0;
    }
  }
  in_RDI->buffer_first = (size_t)(ptVar2->buffer + (in_RDI->buffer_first - 0x4c));
  ptVar2 = (p_ply)strcspn(in_RDI->buffer + in_RDI->buffer_first," \n\r\t");
  if (ptVar2 < (p_ply)(in_RDI->buffer_last - in_RDI->buffer_first)) {
    ply_finish_word(in_RDI,(size_t)ptVar2);
    iVar1 = ply_check_word(ptVar2);
    return iVar1;
  }
  iVar1 = BREFILL(ptVar2);
  if (iVar1 == 0) {
    ply_finish_word(in_RDI,(size_t)ptVar2);
    iVar1 = ply_check_word(ptVar2);
    return iVar1;
  }
  sVar3 = strcspn(in_RDI->buffer + in_RDI->buffer_first + (long)ptVar2," \n\r\t");
  ptVar2 = (p_ply)(ptVar2->buffer + (sVar3 - 0x4c));
  if ((p_ply)(in_RDI->buffer_last - in_RDI->buffer_first) <= ptVar2) {
    ply_ferror(in_RDI,"Token too large");
    return 0;
  }
  ply_finish_word(in_RDI,(size_t)ptVar2);
  iVar1 = ply_check_word(ptVar2);
  return iVar1;
}

Assistant:

static int ply_read_word(p_ply ply) {
    size_t t = 0;
    assert(ply && (ply->fp || ply->gzfp) && ply->io_mode == PLY_READ);
    /* skip leading blanks */
    while (1) {
        t = strspn(BFIRST(ply), " \n\r\t");
        /* check if all buffer was made of blanks */
        if (t >= BSIZE(ply)) {
            if (!BREFILL(ply)) {
                ply_ferror(ply, "Unexpected end of file");
                return 0;
            }
        } else
            break;
    }
    BSKIP(ply, t);
    /* look for a space after the current word */
    t = strcspn(BFIRST(ply), " \n\r\t");
    /* if we didn't reach the end of the buffer, we are done */
    if (t < BSIZE(ply)) {
        ply_finish_word(ply, t);
        return ply_check_word(ply);
    }
    /* otherwise, try to refill buffer */
    if (!BREFILL(ply)) {
        /* if we reached the end of file, try to do with what we have */
        ply_finish_word(ply, t);
        return ply_check_word(ply);
        /* ply_ferror(ply, "Unexpected end of file"); */
        /* return 0; */
    }
    /* keep looking from where we left */
    t += strcspn(BFIRST(ply) + t, " \n\r\t");
    /* check if the token is too large for our buffer */
    if (t >= BSIZE(ply)) {
        ply_ferror(ply, "Token too large");
        return 0;
    }
    /* we are done */
    ply_finish_word(ply, t);
    return ply_check_word(ply);
}